

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trsort.c
# Opt level: O1

void tr_partition(saidx_t *ISAd,saidx_t *first,saidx_t *middle,saidx_t *last,saidx_t **pa,
                 saidx_t **pb,saidx_t v)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  bool bVar11;
  
  iVar6 = 0;
  bVar11 = middle < last;
  if ((bVar11) && (iVar6 = ISAd[*middle], iVar6 == v)) {
    piVar5 = middle + 1;
    do {
      middle = piVar5;
      bVar11 = middle < last;
      if (!bVar11) break;
      iVar6 = ISAd[*middle];
      piVar5 = middle + 1;
    } while (iVar6 == v);
  }
  piVar5 = middle;
  if ((bVar11) && (iVar6 < v)) {
    while (middle = middle + 1, middle < last) {
      iVar1 = *middle;
      iVar6 = ISAd[iVar1];
      if (v < iVar6) break;
      if (iVar6 == v) {
        *middle = *piVar5;
        *piVar5 = iVar1;
        piVar5 = piVar5 + 1;
      }
    }
  }
  piVar7 = last + -1;
  bVar11 = middle < piVar7;
  if ((bVar11) && (iVar6 = ISAd[*piVar7], iVar6 == v)) {
    piVar9 = last + -2;
    do {
      piVar7 = piVar9;
      bVar11 = middle < piVar7;
      if (!bVar11) break;
      iVar6 = ISAd[*piVar7];
      piVar9 = piVar7 + -1;
    } while (iVar6 == v);
  }
  piVar9 = piVar7;
  if ((bVar11) && (v < iVar6)) {
    while (piVar7 = piVar7 + -1, middle < piVar7) {
      iVar6 = *piVar7;
      if (ISAd[iVar6] < v) break;
      if (ISAd[iVar6] == v) {
        *piVar7 = *piVar9;
        *piVar9 = iVar6;
        piVar9 = piVar9 + -1;
      }
    }
  }
LAB_0010601d:
  do {
    if (piVar7 <= middle) {
      if (piVar5 <= piVar9) {
        uVar3 = (uint)((ulong)((long)piVar5 - (long)first) >> 2);
        uVar4 = (uint)((ulong)((long)middle - (long)piVar5) >> 2);
        if ((int)uVar3 < (int)uVar4) {
          uVar4 = uVar3;
        }
        if (0 < (int)uVar4) {
          iVar6 = uVar4 + 1;
          lVar10 = 0;
          do {
            uVar2 = *(undefined4 *)((long)first + lVar10);
            *(undefined4 *)((long)first + lVar10) =
                 *(undefined4 *)((long)middle + lVar10 + (ulong)uVar4 * -4);
            *(undefined4 *)((long)middle + lVar10 + (ulong)uVar4 * -4) = uVar2;
            iVar6 = iVar6 + -1;
            lVar10 = lVar10 + 4;
          } while (1 < iVar6);
        }
        lVar10 = (long)piVar9 - (long)(middle + -1) >> 2;
        uVar4 = (int)((ulong)((long)last - (long)piVar9) >> 2) - 1;
        uVar3 = (uint)lVar10;
        if ((int)uVar3 <= (int)uVar4) {
          uVar4 = uVar3;
        }
        if (0 < (int)uVar4) {
          iVar6 = uVar4 + 1;
          lVar8 = 0;
          do {
            uVar2 = *(undefined4 *)((long)middle + lVar8);
            *(undefined4 *)((long)middle + lVar8) =
                 *(undefined4 *)((long)last + lVar8 + (ulong)uVar4 * -4);
            *(undefined4 *)((long)last + lVar8 + (ulong)uVar4 * -4) = uVar2;
            iVar6 = iVar6 + -1;
            lVar8 = lVar8 + 4;
          } while (1 < iVar6);
        }
        first = (saidx_t *)((long)first + ((long)middle - (long)piVar5));
        last = last + -lVar10;
      }
      *pa = first;
      *pb = last;
      return;
    }
    iVar6 = *middle;
    *middle = *piVar7;
    *piVar7 = iVar6;
    while (middle = middle + 1, middle < piVar7) {
      iVar6 = *middle;
      if (v < ISAd[iVar6]) break;
      if (ISAd[iVar6] == v) {
        *middle = *piVar5;
        *piVar5 = iVar6;
        piVar5 = piVar5 + 1;
      }
    }
LAB_0010600b:
    piVar7 = piVar7 + -1;
  } while (piVar7 <= middle);
  iVar6 = *piVar7;
  if (ISAd[iVar6] < v) goto LAB_0010601d;
  if (ISAd[iVar6] == v) {
    *piVar7 = *piVar9;
    *piVar9 = iVar6;
    piVar9 = piVar9 + -1;
  }
  goto LAB_0010600b;
}

Assistant:

static INLINE
void
tr_partition(const saidx_t *ISAd,
             saidx_t *first, saidx_t *middle, saidx_t *last,
             saidx_t **pa, saidx_t **pb, saidx_t v) {
  saidx_t *a, *b, *c, *d, *e, *f;
  saidx_t t, s;
  saidx_t x = 0;

  for(b = middle - 1; (++b < last) && ((x = ISAd[*b]) == v);) { }
  if(((a = b) < last) && (x < v)) {
    for(; (++b < last) && ((x = ISAd[*b]) <= v);) {
      if(x == v) { SWAP(*b, *a); ++a; }
    }
  }
  for(c = last; (b < --c) && ((x = ISAd[*c]) == v);) { }
  if((b < (d = c)) && (x > v)) {
    for(; (b < --c) && ((x = ISAd[*c]) >= v);) {
      if(x == v) { SWAP(*c, *d); --d; }
    }
  }
  for(; b < c;) {
    SWAP(*b, *c);
    for(; (++b < c) && ((x = ISAd[*b]) <= v);) {
      if(x == v) { SWAP(*b, *a); ++a; }
    }
    for(; (b < --c) && ((x = ISAd[*c]) >= v);) {
      if(x == v) { SWAP(*c, *d); --d; }
    }
  }

  if(a <= d) {
    c = b - 1;
    if((s = a - first) > (t = b - a)) { s = t; }
    for(e = first, f = b - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
    if((s = d - c) > (t = last - d - 1)) { s = t; }
    for(e = b, f = last - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
    first += (b - a), last -= (d - c);
  }
  *pa = first, *pb = last;
}